

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

bool __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::PrepareNextSolveIteration
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  int iVar1;
  bool bVar2;
  function<mp::Solution_()> *in_RDX;
  function<mp::Solution_()> *in_RSI;
  long in_RDI;
  byte bVar3;
  function<mp::sol::Status_()> *unaff_retaddr;
  MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000008;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar2 = MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::IsMOActive((MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        *)(in_RDI + 0x1a8));
  if (bVar2) {
    std::function<mp::sol::Status_()>::function
              ((function<mp::sol::Status_()> *)in_RDX,(function<mp::sol::Status_()> *)in_RSI);
    std::function<mp::Solution_()>::function(in_RDX,in_RSI);
    bVar3 = MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::PrepareMOIteration
                      (in_stack_00000008,unaff_retaddr,
                       (function<mp::Solution_()> *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    std::function<mp::Solution_()>::~function((function<mp::Solution_()> *)0x3d4419);
    std::function<mp::sol::Status_()>::~function((function<mp::sol::Status_()> *)0x3d4423);
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x560);
    *(int *)(in_RDI + 0x560) = iVar1 + 1;
    bVar3 = iVar1 == 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool PrepareNextSolveIteration(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    if (MPCD( IsMOActive() ))
      return MPD( PrepareMOIteration(get_stt, get_sol) );
    return !(n_solve_iter_++);
  }